

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

Node<KalahaState<(short)6>_> * __thiscall
MCTS::Node<KalahaState<(short)6>_>::add_child
          (Node<KalahaState<(short)6>_> *this,Move *move,KalahaState<(short)6> *state)

{
  short sVar1;
  iterator __position;
  short *psVar2;
  short *psVar3;
  Node<KalahaState<(short)6>_> *pNVar4;
  pointer ppNVar5;
  short *psVar6;
  Node<KalahaState<(short)6>_> *node;
  Node<KalahaState<(short)6>_> *local_28;
  
  pNVar4 = (Node<KalahaState<(short)6>_> *)operator_new(0x60);
  pNVar4->move = *move;
  pNVar4->parent = this;
  pNVar4->player_to_move = state->player_to_move;
  pNVar4->wins = 0.0;
  pNVar4->visits = 0;
  KalahaState<(short)6>::get_moves(&pNVar4->moves,state);
  (pNVar4->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4->UCT_score = 0.0;
  (pNVar4->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __position._M_current =
       (this->children).
       super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = pNVar4;
  if (__position._M_current ==
      (this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<MCTS::Node<KalahaState<(short)6>>*,std::allocator<MCTS::Node<KalahaState<(short)6>>*>>::
    _M_realloc_insert<MCTS::Node<KalahaState<(short)6>>*const&>
              ((vector<MCTS::Node<KalahaState<(short)6>>*,std::allocator<MCTS::Node<KalahaState<(short)6>>*>>
                *)&this->children,__position,&local_28);
    ppNVar5 = (this->children).
              super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar4;
    ppNVar5 = (this->children).
              super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->children).
    super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar5;
  }
  if ((this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppNVar5) {
    psVar2 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar3 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar2 != psVar3) {
      sVar1 = *move;
      psVar6 = psVar2;
      do {
        if (*psVar6 == sVar1) {
          *psVar6 = psVar3[-1];
          psVar3[-1] = sVar1;
          std::vector<short,_std::allocator<short>_>::resize
                    (&this->moves,((long)psVar3 - (long)psVar2 >> 1) - 1);
          return local_28;
        }
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar3);
    }
    assertion_failed("itr != moves.end()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf6);
  }
  assertion_failed("! children.empty()",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0xf2);
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}